

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

void __thiscall cashew::JSPrinter::printObject(JSPrinter *this,Ref node)

{
  char cVar1;
  Type TVar2;
  bool bVar3;
  int iVar4;
  Ref *pRVar5;
  size_t sVar6;
  char *pcVar7;
  uint x;
  ulong uVar8;
  char *s;
  Ref local_60;
  Ref node_local;
  Ref args;
  char *local_48;
  char *local_40;
  
  local_60.inst = node.inst;
  emit(this,'{');
  this->indent = this->indent + 1;
  newline(this);
  pRVar5 = Ref::operator[](&local_60,1);
  node_local.inst = pRVar5->inst;
  uVar8 = 0;
  do {
    sVar6 = cashew::Value::size(node_local.inst);
    if (sVar6 <= uVar8) {
      this->indent = this->indent + -1;
      newline(this);
      emit(this,'}');
      return;
    }
    if (uVar8 != 0) {
      if (this->pretty == true) {
        emit(this,", ");
      }
      else {
        emit(this,',');
      }
      newline(this);
    }
    x = (uint)uVar8;
    pRVar5 = Ref::operator[](&node_local,x);
    pRVar5 = Ref::operator[](pRVar5,0);
    TVar2 = pRVar5->inst->type;
    pRVar5 = Ref::operator[](&node_local,x);
    pRVar5 = Ref::operator[](pRVar5,0);
    if (TVar2 == Array) {
      pRVar5 = Ref::operator[](pRVar5,0);
      bVar3 = Ref::operator==(pRVar5,(IString *)STRING);
      pRVar5 = Ref::operator[](&node_local,x);
      pRVar5 = Ref::operator[](pRVar5,0);
      if (bVar3) {
        pRVar5 = Ref::operator[](pRVar5,1);
        pcVar7 = cashew::Value::getCString(pRVar5->inst);
        bVar3 = true;
        goto LAB_00d44084;
      }
      pRVar5 = Ref::operator[](pRVar5,0);
      bVar3 = Ref::operator==(pRVar5,(IString *)GETTER);
      if (bVar3) {
        local_40 = (char *)GETTER._8_8_;
        pRVar5 = Ref::operator[](&node_local,x);
        bVar3 = false;
        pRVar5 = Ref::operator[](pRVar5,0);
        pRVar5 = Ref::operator[](pRVar5,1);
        pcVar7 = cashew::Value::getCString(pRVar5->inst);
        goto LAB_00d4408c;
      }
      pRVar5 = Ref::operator[](&node_local,x);
      pRVar5 = Ref::operator[](pRVar5,0);
      pRVar5 = Ref::operator[](pRVar5,0);
      bVar3 = Ref::operator==(pRVar5,(IString *)SETTER);
      if (!bVar3) {
        abort();
      }
      local_40 = (char *)SETTER._8_8_;
      pRVar5 = Ref::operator[](&node_local,x);
      bVar3 = false;
      pRVar5 = Ref::operator[](pRVar5,0);
      pRVar5 = Ref::operator[](pRVar5,1);
      pcVar7 = cashew::Value::getCString(pRVar5->inst);
      pRVar5 = Ref::operator[](&node_local,x);
      pRVar5 = Ref::operator[](pRVar5,0);
      pRVar5 = Ref::operator[](pRVar5,2);
      local_48 = cashew::Value::getCString(pRVar5->inst);
      s = pcVar7;
    }
    else {
      pcVar7 = cashew::Value::getCString(pRVar5->inst);
      bVar3 = false;
LAB_00d44084:
      local_40 = (char *)0x0;
LAB_00d4408c:
      local_48 = (char *)0x0;
      s = pcVar7;
    }
    while( true ) {
      cVar1 = *pcVar7;
      if (cVar1 == '\0') break;
      iVar4 = isalnum((int)cVar1);
      if (((iVar4 == 0) && (cVar1 != '_')) && (cVar1 != '$')) {
        bVar3 = true;
        break;
      }
      pcVar7 = pcVar7 + 1;
    }
    if (local_40 != (char *)0x0) {
      emit(this,local_40);
      space(this);
    }
    if (bVar3) {
      emit(this,'\"');
      emit(this,s);
      emit(this,'\"');
    }
    else {
      emit(this,s);
    }
    if (local_40 == (char *)0x0) {
      emit(this,":");
    }
    else {
      emit(this,'(');
      if (local_48 != (char *)0x0) {
        emit(this,local_48);
      }
      emit(this,')');
    }
    space(this);
    pRVar5 = Ref::operator[](&node_local,x);
    pRVar5 = Ref::operator[](pRVar5,1);
    print(this,pRVar5->inst);
    uVar8 = uVar8 + 1;
  } while( true );
}

Assistant:

void printObject(Ref node) {
    emit('{');
    indent++;
    newline();
    Ref args = node[1];
    for (size_t i = 0; i < args->size(); i++) {
      if (i > 0) {
        pretty ? emit(", ") : emit(',');
        newline();
      }
      bool needQuote = false;
      const char* getterSetter = nullptr;
      const char* setterParam = nullptr;
      const char* str;
      if (args[i][0]->isArray()) {
        if (args[i][0][0] == STRING) {
          // A quoted string.
          needQuote = true;
          str = args[i][0][1]->getCString();
        } else if (args[i][0][0] == GETTER) {
          getterSetter = GETTER.str.data();
          str = args[i][0][1]->getCString();
        } else if (args[i][0][0] == SETTER) {
          getterSetter = SETTER.str.data();
          str = args[i][0][1]->getCString();
          setterParam = args[i][0][2]->getCString();
        } else {
          abort();
        }
      } else {
        // Just a raw string, no quotes.
        str = args[i][0]->getCString();
      }
      const char* check = str;
      while (*check) {
        if (!isalnum(*check) && *check != '_' && *check != '$') {
          needQuote = true;
          break;
        }
        check++;
      }
      if (getterSetter != nullptr) {
        emit(getterSetter);
        space();
      }
      if (needQuote) {
        emit('"');
      }
      emit(str);
      if (needQuote) {
        emit('"');
      }
      if (getterSetter != nullptr) {
        emit('(');
        if (setterParam != nullptr) {
          emit(setterParam);
        }
        emit(')');
      } else {
        emit(":");
      }
      space();
      print(args[i][1]);
    }
    indent--;
    newline();
    emit('}');
  }